

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int test_then_block(LexState *ls)

{
  int iVar1;
  int condexit;
  LexState *ls_local;
  
  luaX_next(ls);
  iVar1 = cond(ls);
  checknext(ls,0x112);
  block(ls);
  return iVar1;
}

Assistant:

static int test_then_block(LexState*ls){
int condexit;
luaX_next(ls);
condexit=cond(ls);
checknext(ls,TK_THEN);
block(ls);
return condexit;
}